

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  Rep *pRVar1;
  ulong uVar2;
  ulong uVar3;
  
  pRVar1 = this->rep_;
  if ((pRVar1 != (Rep *)0x0) && (this->arena_ == (Arena *)0x0)) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)pRVar1->allocated_size;
    if (pRVar1->allocated_size < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      if ((long *)pRVar1->elements[uVar2] != (long *)0x0) {
        (**(code **)(*pRVar1->elements[uVar2] + 8))();
      }
    }
    operator_delete(this->rep_);
  }
  this->rep_ = (Rep *)0x0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::Destroy() {
  if (rep_ != NULL && arena_ == NULL) {
    int n = rep_->allocated_size;
    void* const* elements = rep_->elements;
    for (int i = 0; i < n; i++) {
      TypeHandler::Delete(cast<TypeHandler>(elements[i]), NULL);
    }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t size = total_size_ * sizeof(elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(rep_), size);
#else
    ::operator delete(static_cast<void*>(rep_));
#endif
  }
  rep_ = NULL;
}